

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

double __thiscall
HighsDomain::getColUpperPos(HighsDomain *this,HighsInt col,HighsInt stackpos,HighsInt *pos)

{
  bool bVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double ub;
  double local_20;
  
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 800),(long)in_ESI);
  local_20 = *pvVar2;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2a8),(long)in_ESI);
  *in_RCX = *pvVar3;
  while( true ) {
    bVar1 = true;
    if ((*in_RCX <= in_EDX) && (bVar1 = false, *in_RCX != -1)) {
      pvVar4 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
               operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           *)(in_RDI + 0x78),(long)*in_RCX);
      bVar1 = pvVar4->first == local_20;
    }
    if (!bVar1) break;
    pvVar4 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
             operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                        (in_RDI + 0x78),(long)*in_RCX);
    local_20 = pvVar4->first;
    pvVar4 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
             operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                        (in_RDI + 0x78),(long)*in_RCX);
    *in_RCX = pvVar4->second;
  }
  return local_20;
}

Assistant:

double HighsDomain::getColUpperPos(HighsInt col, HighsInt stackpos,
                                   HighsInt& pos) const {
  double ub = col_upper_[col];
  pos = colUpperPos_[col];
  while (pos > stackpos || (pos != -1 && prevboundval_[pos].first == ub)) {
    ub = prevboundval_[pos].first;
    pos = prevboundval_[pos].second;
  }
  return ub;
}